

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O0

void test_resize(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__1;
  nng_err result_;
  int expect [1024];
  int i;
  int rv;
  nni_id_map m;
  
  for (expect[0x3fe] = 0; expect[0x3fe] < 0x400; expect[0x3fe] = expect[0x3fe] + 1) {
    (&result__1)[expect[0x3fe]] = expect[0x3fe];
  }
  nni_id_map_init((nni_id_map *)&i,0,0,false);
  expect[0x3fe] = 0;
  do {
    if (0x3ff < expect[0x3fe]) {
      expect[0x3fe] = 0;
      do {
        if (0x3ff < expect[0x3fe]) {
          nni_id_map_fini((nni_id_map *)&i);
          return;
        }
        nVar1 = nni_id_remove((nni_id_map *)&i,(long)expect[0x3fe]);
        expect[0x3ff] = nVar1;
        if (nVar1 != NNG_OK) {
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                                 ,0x81,"%s: expected success, got %s (%d)","rv",pcVar3,nVar1);
          if (iVar2 == 0) {
            acutest_abort_();
          }
        }
        expect[0x3fe] = expect[0x3fe] + 1;
      } while( true );
    }
    nVar1 = nni_id_set((nni_id_map *)&i,(long)expect[0x3fe],&result__1 + expect[0x3fe]);
    expect[0x3ff] = nVar1;
    if (nVar1 != NNG_OK) {
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                             ,0x7b,"%s: expected success, got %s (%d)","rv",pcVar3,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
    }
    expect[0x3fe] = expect[0x3fe] + 1;
  } while( true );
}

Assistant:

void
test_resize(void)
{
	nni_id_map m;
	int        rv;
	int        i;
	int        expect[1024];

	for (i = 0; i < 1024; i++) {
		expect[i] = i;
	}

	nni_id_map_init(&m, 0, 0, false);

	for (i = 0; i < 1024; i++) {
		if ((rv = nni_id_set(&m, i, &expect[i])) != 0) {
			NUTS_PASS(rv);
		}
	}

	for (i = 0; i < 1024; i++) {
		if ((rv = nni_id_remove(&m, i)) != 0) {
			NUTS_PASS(rv);
		}
	}
	nni_id_map_fini(&m);
}